

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3IdListDelete(sqlite3 *db,IdList *pList)

{
  int local_1c;
  int i;
  IdList *pList_local;
  sqlite3 *db_local;
  
  if (pList != (IdList *)0x0) {
    for (local_1c = 0; local_1c < pList->nId; local_1c = local_1c + 1) {
      sqlite3DbFree(db,pList->a[local_1c].zName);
    }
    sqlite3DbFreeNN(db,pList);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3IdListDelete(sqlite3 *db, IdList *pList){
  int i;
  if( pList==0 ) return;
  assert( pList->eU4!=EU4_EXPR ); /* EU4_EXPR mode is not currently used */
  for(i=0; i<pList->nId; i++){
    sqlite3DbFree(db, pList->a[i].zName);
  }
  sqlite3DbFreeNN(db, pList);
}